

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,VarCounter>::
ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,VarCounter>::ObjHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,VarCounter> *this)

{
  int iVar1;
  
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_VarCounter>::ReadUInt
            ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_VarCounter> *)
             this,*(uint *)(*(long *)(this + 8) + 8));
  iVar1 = NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_VarCounter>::
          ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_VarCounter>
                    *)this,1,**(int **)(this + 8) + 1);
  ReadLinearExpr<mp::NLHandler<mp::NullNLHandler<int>,int>::LinearExprHandler>(this,iVar1);
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadLinearExpr() {
  LinearHandler lh(*this);
  int index = ReadUInt(lh.num_items());
  // The number of terms should be less than num_vars because common
  // expressions are not allowed in a linear expression.
  int num_terms = ReadUInt(1, header_.num_vars + 1u);
  reader_.ReadTillEndOfLine();
  if (lh.SkipExpr(index))
    ReadLinearExpr(num_terms, NullLinearExprHandler());
  else
    ReadLinearExpr(num_terms, lh.OnLinearExpr(index, num_terms));
}